

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O3

void __thiscall BRTS<RemSP>::PerformLabeling(BRTS<RemSP> *this)

{
  Run *pRVar1;
  uint height;
  uint uVar2;
  Mat1b *pMVar3;
  int *piVar4;
  Mat1i *pMVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint *puVar10;
  int iVar11;
  uint uVar12;
  uint64_t *puVar13;
  Run *pRVar14;
  long lVar15;
  ulong uVar16;
  unsigned_short uVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar24;
  undefined1 auVar23 [16];
  Mat aMStack_b8 [96];
  Scalar_ local_58 [16];
  undefined1 local_48 [16];
  
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  height = *(uint *)&pMVar3->field_0x8;
  uVar2 = *(uint *)&pMVar3->field_0xc;
  (this->data_compressed).height = height;
  (this->data_compressed).width = uVar2;
  uVar12 = uVar2 + 0x3f;
  if (-1 < (int)uVar2) {
    uVar12 = uVar2;
  }
  iVar11 = ((int)uVar12 >> 6) + 1;
  (this->data_compressed).data_width = iVar11;
  uVar12 = iVar11 * height;
  uVar16 = 0xffffffffffffffff;
  if (-1 < (int)uVar12) {
    uVar16 = (ulong)uVar12 * 8;
  }
  puVar13 = (uint64_t *)operator_new__(uVar16);
  (this->data_compressed).bits = puVar13;
  InitCompressedData(this,&this->data_compressed);
  (this->data_runs).height = height;
  (this->data_runs).width = uVar2;
  pRVar14 = (Run *)operator_new__((ulong)(((uVar2 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar14;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar11 = *(int *)&pMVar3->field_0x8;
  iVar24 = *(int *)&pMVar3->field_0xc;
  RemSP::P_ = (uint *)operator_new__((ulong)(((iVar24 - (iVar24 + 1 >> 0x1f)) + 1 >> 1) *
                                             ((iVar11 - (iVar11 + 1 >> 0x1f)) + 1 >> 1) + 1) << 2);
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  FindRuns(this,(this->data_compressed).bits,height,(this->data_compressed).data_width,pRVar14);
  pRVar14 = (this->data_runs).runs;
  piVar4 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(aMStack_b8,*piVar4,piVar4[1],4);
  local_48 = (undefined1  [16])0x0;
  local_58[0] = (Scalar_)0x0;
  local_58[1] = (Scalar_)0x0;
  local_58[2] = (Scalar_)0x0;
  local_58[3] = (Scalar_)0x0;
  local_58[4] = (Scalar_)0x0;
  local_58[5] = (Scalar_)0x0;
  local_58[6] = (Scalar_)0x0;
  local_58[7] = (Scalar_)0x0;
  local_58[8] = (Scalar_)0x0;
  local_58[9] = (Scalar_)0x0;
  local_58[10] = (Scalar_)0x0;
  local_58[0xb] = (Scalar_)0x0;
  local_58[0xc] = (Scalar_)0x0;
  local_58[0xd] = (Scalar_)0x0;
  local_58[0xe] = (Scalar_)0x0;
  local_58[0xf] = (Scalar_)0x0;
  cv::Mat::operator=(aMStack_b8,local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     aMStack_b8);
  cv::Mat::~Mat(aMStack_b8);
  puVar10 = RemSP::P_;
  auVar9 = _DAT_00328440;
  auVar8 = _DAT_00328430;
  auVar7 = _DAT_00328420;
  if (0 < (int)height) {
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar6 = **(long **)&pMVar5->field_0x48;
    lVar15 = *(long *)&pMVar5->field_0x10 + 8;
    uVar16 = 0;
    do {
      uVar17 = pRVar14->start_pos;
      while (uVar17 != 0xffff) {
        if (uVar17 < pRVar14->end_pos) {
          uVar2 = puVar10[pRVar14->label];
          lVar18 = (ulong)pRVar14->end_pos - (ulong)uVar17;
          lVar19 = lVar18 + -1;
          auVar21._8_4_ = (int)lVar19;
          auVar21._0_8_ = lVar19;
          auVar21._12_4_ = (int)((ulong)lVar19 >> 0x20);
          lVar19 = lVar15 + (ulong)uVar17 * 4;
          auVar21 = auVar21 ^ auVar9;
          uVar20 = 0;
          do {
            auVar22._8_4_ = (int)uVar20;
            auVar22._0_8_ = uVar20;
            auVar22._12_4_ = (int)(uVar20 >> 0x20);
            auVar23 = (auVar22 | auVar8) ^ auVar9;
            iVar11 = auVar21._4_4_;
            if ((bool)(~(iVar11 < auVar23._4_4_ ||
                        auVar21._0_4_ < auVar23._0_4_ && auVar23._4_4_ == iVar11) & 1)) {
              *(uint *)(lVar19 + -8 + uVar20 * 4) = uVar2;
            }
            if (auVar23._12_4_ <= auVar21._12_4_ &&
                (auVar23._8_4_ <= auVar21._8_4_ || auVar23._12_4_ != auVar21._12_4_)) {
              *(uint *)(lVar19 + -4 + uVar20 * 4) = uVar2;
            }
            auVar22 = (auVar22 | auVar7) ^ auVar9;
            iVar24 = auVar22._4_4_;
            if (iVar24 <= iVar11 && (iVar24 != iVar11 || auVar22._0_4_ <= auVar21._0_4_)) {
              *(uint *)(lVar19 + uVar20 * 4) = uVar2;
              *(uint *)(lVar19 + 4 + uVar20 * 4) = uVar2;
            }
            uVar20 = uVar20 + 4;
          } while ((lVar18 + 3U & 0xfffffffffffffffc) != uVar20);
        }
        pRVar1 = pRVar14 + 1;
        pRVar14 = pRVar14 + 1;
        uVar17 = pRVar1->start_pos;
      }
      pRVar14 = pRVar14 + 1;
      uVar16 = uVar16 + 1;
      lVar15 = lVar15 + lVar6;
    } while (uVar16 != height);
  }
  if (puVar10 != (uint *)0x0) {
    operator_delete__(puVar10);
  }
  pRVar14 = (this->data_runs).runs;
  if (pRVar14 != (Run *)0x0) {
    operator_delete__(pRVar14);
  }
  puVar13 = (this->data_compressed).bits;
  if (puVar13 != (uint64_t *)0x0) {
    operator_delete__(puVar13);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        img_labels_ = cv::Mat1i(img_.size(), 0); // (0-init)
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) {
                    labels[j] = label;
                }
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }